

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

BOOL __thiscall Js::RecyclableObjectAddress::Set(RecyclableObjectAddress *this,Var updateObject)

{
  bool bVar1;
  BOOL BVar2;
  RecyclableObject *object;
  
  bVar1 = VarIs<Js::RecyclableObject>(this->parentObj);
  if (bVar1) {
    object = VarTo<Js::RecyclableObject>(this->parentObj);
    BVar2 = JavascriptOperators::SetProperty
                      (object,object,this->propId,updateObject,
                       (((((object->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase
                       ).scriptContext.ptr,PropertyOperation_None);
    return BVar2;
  }
  return 0;
}

Assistant:

BOOL RecyclableObjectAddress::Set(Var updateObject)
    {
        if (Js::VarIs<Js::RecyclableObject>(parentObj))
        {
            Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(parentObj);

            ScriptContext* requestContext = obj->GetScriptContext(); //TODO: real requestContext
            return Js::JavascriptOperators::SetProperty(obj, obj, propId, updateObject, requestContext);
        }
        return FALSE;
    }